

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionPair.h
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionPair::ChCollisionPair
          (ChCollisionPair *this,ChGeometry *mgeo1,ChGeometry *mgeo2)

{
  double dVar1;
  
  *(undefined8 *)((long)(this->p2).m_data + 4) = 0;
  *(undefined8 *)((long)(this->p2).m_data + 0xc) = 0;
  *(undefined8 *)((long)(this->p2).m_data + 0x14) = 0;
  (this->normal).m_data[1] = 0.0;
  (this->normal).m_data[2] = 0.0;
  (this->p1).m_data[0] = 0.0;
  (this->p1).m_data[1] = 0.0;
  (this->p1).m_data[2] = 0.0;
  (this->p2).m_data[0] = 0.0;
  this->geo1 = mgeo1;
  this->geo2 = mgeo2;
  if (this != (ChCollisionPair *)Q_FLIP_AROUND_Z) {
    (this->p2).m_data[0] = VNULL;
    (this->p2).m_data[1] = DAT_00b90ac0;
    (this->p2).m_data[2] = DAT_00b90ac8;
  }
  (this->p1).m_data[0] = (this->p2).m_data[0];
  dVar1 = (this->p2).m_data[2];
  (this->p1).m_data[1] = (this->p2).m_data[1];
  (this->p1).m_data[2] = dVar1;
  (this->normal).m_data[0] = 1.0;
  (this->normal).m_data[1] = 0.0;
  (this->normal).m_data[2] = 0.0;
  this->norm_dist = 0.0;
  this->just_intersection = true;
  return;
}

Assistant:

ChCollisionPair(geometry::ChGeometry* mgeo1, geometry::ChGeometry* mgeo2) {
        geo1 = mgeo1;
        geo2 = mgeo2;
        p1 = p2 = VNULL;
        normal.Set(1, 0, 0);
        norm_dist = 0.;
        just_intersection = true;
    }